

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagernetworkinformationbackend.cpp
# Opt level: O3

void __thiscall
QNetworkManagerNetworkInformationBackend::onDeviceTypeChanged
          (QNetworkManagerNetworkInformationBackend *this,NMDeviceType newDevice)

{
  TransportMedium medium;
  
  medium = Unknown;
  if (newDevice - NM_DEVICE_TYPE_ETHERNET < 8) {
    medium = *(TransportMedium *)(&DAT_0010c2bc + (ulong)(newDevice - NM_DEVICE_TYPE_ETHERNET) * 4);
  }
  QNetworkInformationBackend::setTransportMedium((QNetworkInformationBackend *)this,medium);
  return;
}

Assistant:

QNetworkInformation::TransportMedium
transportMediumFromDeviceType(QNetworkManagerInterface::NMDeviceType type)
{
    switch (type) {
    case QNetworkManagerInterface::NM_DEVICE_TYPE_ETHERNET:
        return QNetworkInformation::TransportMedium::Ethernet;
    case QNetworkManagerInterface::NM_DEVICE_TYPE_WIFI:
        return QNetworkInformation::TransportMedium::WiFi;
    case QNetworkManagerInterface::NM_DEVICE_TYPE_BT:
        return QNetworkInformation::TransportMedium::Bluetooth;
    case QNetworkManagerInterface::NM_DEVICE_TYPE_MODEM:
        return QNetworkInformation::TransportMedium::Cellular;

    case QNetworkManagerInterface::NM_DEVICE_TYPE_UNKNOWN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_GENERIC:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_UNUSED1:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_UNUSED2:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_OLPC_MESH:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_WIMAX:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_INFINIBAND:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_BOND:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_VLAN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_ADSL:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_BRIDGE:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_TEAM:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_TUN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_IP_TUNNEL:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_MACVLAN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_VXLAN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_VETH:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_MACSEC:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_DUMMY:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_PPP:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_OVS_INTERFACE:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_OVS_PORT:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_OVS_BRIDGE:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_WPAN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_6LOWPAN:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_WIREGUARD:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_WIFI_P2P:
    case QNetworkManagerInterface::NM_DEVICE_TYPE_VRF:
        break;
    }
    // While the list is exhaustive of the enum there can be additional
    // entries added in NetworkManager that isn't listed here
    return QNetworkInformation::TransportMedium::Unknown;
}